

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall Spaghetti<RemSP>::FirstScan(Spaghetti<RemSP> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  long lVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar9 = *(uint *)&pMVar3->field_0x8;
  uVar25 = *(uint *)&pMVar3->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar9 & 0xfffffffe;
  this->o_rows = (uVar9 & 0x80000001) == 1;
  this->e_cols = uVar25 & 0xfffffffe;
  this->o_cols = (uVar25 & 0x80000001) == 1;
  puVar6 = RemSP::P_;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  lVar45 = *(long *)&pMVar3->field_0x10;
  if (uVar9 == 1) {
    lVar4 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar44 = (long)(int)uVar25 + -2;
    uVar32 = 0xfffffffffffffffe;
LAB_00161704:
    do {
      lVar30 = (long)(int)uVar32;
      uVar32 = lVar30 + 2;
      iVar35 = (int)lVar44;
      if (iVar35 <= (int)uVar32) {
        if (iVar35 < (int)uVar32) {
          if (*(char *)(lVar45 + uVar32) == '\0') {
            *(undefined4 *)(lVar4 + 8 + lVar30 * 4) = 0;
            return;
          }
        }
        else if (*(char *)(lVar45 + uVar32) == '\0') {
LAB_00161b1c:
          if (*(char *)(lVar45 + 1 + uVar32) != '\0') {
            puVar6[RemSP::length_] = RemSP::length_;
            uVar9 = RemSP::length_ + 1;
            *(uint *)(lVar4 + uVar32 * 4) = RemSP::length_;
            RemSP::length_ = uVar9;
            return;
          }
          *(undefined4 *)(lVar4 + uVar32 * 4) = 0;
          return;
        }
        puVar6[RemSP::length_] = RemSP::length_;
        uVar9 = RemSP::length_ + 1;
        *(uint *)(lVar4 + 8 + lVar30 * 4) = RemSP::length_;
        RemSP::length_ = uVar9;
        return;
      }
      if (*(char *)(lVar45 + uVar32) == '\0') goto LAB_00161738;
      cVar2 = *(char *)(lVar45 + 3 + lVar30);
      puVar6[RemSP::length_] = RemSP::length_;
      uVar9 = RemSP::length_ + 1;
      *(uint *)(lVar4 + 8 + lVar30 * 4) = RemSP::length_;
      RemSP::length_ = uVar9;
      uVar12 = uVar32;
    } while (cVar2 == '\0');
    do {
      uVar31 = uVar12 + 2;
      if (lVar44 <= (long)uVar31) {
        uVar32 = (ulong)(int)uVar31;
        if (iVar35 < (int)uVar31) {
          if (*(char *)(lVar45 + uVar32) == '\0') {
            *(undefined4 *)(lVar4 + uVar32 * 4) = 0;
            return;
          }
        }
        else if (*(char *)(lVar45 + uVar32) == '\0') goto LAB_00161b1c;
        *(undefined4 *)(lVar4 + uVar32 * 4) = *(undefined4 *)(lVar4 + (long)(int)uVar12 * 4);
        return;
      }
      if (*(char *)(lVar45 + uVar31) == '\0') {
        uVar32 = uVar31 & 0xffffffff;
LAB_00161738:
        uVar31 = (ulong)(int)uVar32;
        if (*(char *)(lVar45 + 1 + uVar31) == '\0') {
          uVar15 = 0;
          goto LAB_00161787;
        }
        puVar6[RemSP::length_] = RemSP::length_;
        uVar12 = uVar31;
        uVar9 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
      }
      else {
        if (*(char *)(lVar45 + 3 + uVar12) == '\0') goto LAB_00161781;
        lVar30 = uVar12 * 4;
        uVar12 = uVar31;
        uVar9 = *(uint *)(lVar4 + lVar30);
      }
      *(uint *)(lVar4 + uVar12 * 4) = uVar9;
    } while( true );
  }
  uVar32 = 0xfffffffffffffffe;
  lVar44 = lVar45 + **(long **)&pMVar3->field_0x48;
  lVar28 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar4 = (long)(int)uVar25 + -2;
  lVar30 = lVar45 + 2 + **(long **)&pMVar3->field_0x48;
  while( true ) {
    lVar36 = (long)(int)uVar32;
    uVar32 = lVar36 + 2;
    iVar35 = (int)lVar4;
    if (iVar35 <= (int)uVar32) break;
    if (*(char *)(lVar45 + uVar32) == '\0') {
      uVar12 = uVar32 & 0xffffffff;
      if (*(char *)(lVar44 + uVar32) == '\0') goto LAB_00161807;
    }
    else {
      uVar12 = uVar32 & 0xffffffff;
    }
LAB_00161973:
    cVar2 = *(char *)(lVar45 + 1 + uVar32);
    puVar6[RemSP::length_] = RemSP::length_;
    uVar8 = RemSP::length_ + 1;
    *(uint *)(lVar28 + uVar32 * 4) = RemSP::length_;
    RemSP::length_ = uVar8;
    if (cVar2 != '\0') goto LAB_0016183b;
LAB_00161870:
    iVar40 = (int)uVar12;
    lVar27 = (long)iVar40;
    lVar36 = lVar28 + lVar27 * 4;
    lVar26 = lVar30 + lVar27;
    lVar43 = lVar27 << 0x20;
    lVar1 = lVar45 + 2 + lVar27;
    lVar38 = 0;
    while( true ) {
      lVar10 = lVar43 >> 0x20;
      if (lVar4 <= lVar38 + lVar27 + 2) {
        uVar12 = (ulong)(iVar40 + 2) + lVar38;
        uVar32 = lVar43 + 0x200000000 >> 0x20;
        if (iVar35 < (int)uVar12) {
          if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) {
            *(undefined4 *)(lVar28 + uVar32 * 4) = 0;
            goto LAB_00161be3;
          }
        }
        else {
          if (*(char *)(lVar45 + uVar32) != '\0') {
            if (*(char *)(lVar44 + 1 + lVar10) != '\0') goto LAB_00161bda;
            goto LAB_00161a5f;
          }
          if (*(char *)(lVar44 + uVar32) == '\0') {
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_00161b62;
          }
        }
        lVar45 = lVar43 + 0x200000000 >> 0x1e;
        if (*(char *)(lVar44 + 1 + lVar10) == '\0') {
          puVar6[RemSP::length_] = RemSP::length_;
          uVar8 = RemSP::length_ + 1;
          *(uint *)(lVar28 + lVar45) = RemSP::length_;
          RemSP::length_ = uVar8;
        }
        else {
          *(undefined4 *)(lVar28 + lVar45) = *(undefined4 *)(lVar28 + lVar10 * 4);
        }
        goto LAB_00161be3;
      }
      if (*(char *)(lVar1 + lVar38) != '\0') {
        uVar12 = (ulong)(iVar40 + 2) + lVar38;
        if (*(char *)(lVar44 + 1 + lVar10) != '\0') {
          uVar32 = uVar12 & 0xffffffff;
          goto LAB_00161859;
        }
        uVar32 = lVar43 + 0x200000000 >> 0x20;
        goto LAB_00161973;
      }
      if (*(char *)(lVar26 + lVar38) == '\0') {
        uVar32 = (ulong)(iVar40 + (int)lVar38 + 2);
        goto LAB_00161807;
      }
      if (*(char *)(lVar1 + 1 + lVar38) != '\0') break;
      if (*(char *)(lVar26 + -1 + lVar38) == '\0') {
        puVar6[RemSP::length_] = RemSP::length_;
        uVar8 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
      }
      else {
        uVar8 = *(uint *)(lVar36 + lVar38 * 4);
      }
      *(uint *)(lVar36 + 8 + lVar38 * 4) = uVar8;
      lVar38 = lVar38 + 2;
      lVar43 = lVar43 + 0x200000000;
    }
    lVar26 = lVar27 + 2 + lVar38;
    if (*(char *)(lVar30 + -1 + lVar27 + lVar38) == '\0') {
      uVar12 = (ulong)RemSP::length_;
      puVar6[uVar12] = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
    }
    else {
      uVar12 = (ulong)*(uint *)(lVar36 + lVar38 * 4);
    }
    uVar32 = (ulong)(iVar40 + 2) + lVar38 & 0xffffffff;
    while( true ) {
      *(int *)(lVar28 + lVar26 * 4) = (int)uVar12;
      uVar12 = uVar32 & 0xffffffff;
LAB_0016183b:
      while( true ) {
        lVar36 = (long)(int)uVar12;
        uVar32 = lVar36 + 2;
        if (iVar35 <= (int)uVar32) {
          if ((int)uVar32 <= iVar35) {
            if ((*(char *)(lVar45 + uVar32) != '\0') || (*(char *)(lVar44 + uVar32) != '\0'))
            goto LAB_00161bda;
            goto LAB_00161b62;
          }
          if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0'))
          goto LAB_0016568d;
          *(undefined4 *)(lVar28 + 8 + lVar36 * 4) = *(undefined4 *)(lVar28 + lVar36 * 4);
          goto LAB_00161be3;
        }
        if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) break;
LAB_00161859:
        lVar36 = (long)(int)uVar32;
        cVar2 = *(char *)(lVar45 + 1 + lVar36);
        *(undefined4 *)(lVar28 + lVar36 * 4) = *(undefined4 *)(lVar28 + -8 + lVar36 * 4);
        uVar12 = uVar32 & 0xffffffff;
        if (cVar2 == '\0') goto LAB_00161870;
      }
LAB_00161807:
      lVar26 = (long)(int)uVar32;
      if ((*(char *)(lVar26 + 1 + lVar45) == '\0') && (*(char *)(lVar44 + 1 + lVar26) == '\0'))
      break;
      uVar12 = (ulong)RemSP::length_;
      puVar6[uVar12] = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
    }
    *(undefined4 *)(lVar28 + (long)(int)uVar32 * 4) = 0;
  }
  if (iVar35 < (int)uVar32) {
    if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) {
LAB_0016568d:
      *(undefined4 *)(lVar28 + 8 + lVar36 * 4) = 0;
    }
    else {
      puVar6[RemSP::length_] = RemSP::length_;
      uVar8 = RemSP::length_ + 1;
      *(uint *)(lVar28 + 8 + lVar36 * 4) = RemSP::length_;
      RemSP::length_ = uVar8;
    }
  }
  else if ((*(char *)(lVar45 + uVar32) == '\0') && (*(char *)(lVar44 + uVar32) == '\0')) {
LAB_00161b62:
    lVar30 = (long)(int)uVar32;
    if ((*(char *)(lVar30 + 1 + lVar45) == '\0') && (*(char *)(lVar44 + 1 + lVar30) == '\0')) {
      *(undefined4 *)(lVar28 + lVar30 * 4) = 0;
    }
    else {
      puVar6[RemSP::length_] = RemSP::length_;
      uVar8 = RemSP::length_ + 1;
      *(uint *)(lVar28 + lVar30 * 4) = RemSP::length_;
      RemSP::length_ = uVar8;
    }
  }
  else {
LAB_00161a5f:
    puVar6[RemSP::length_] = RemSP::length_;
    uVar8 = RemSP::length_ + 1;
    *(uint *)(lVar28 + uVar32 * 4) = RemSP::length_;
    RemSP::length_ = uVar8;
  }
LAB_00161be3:
  lVar45 = 2;
  lVar44 = 1;
  lVar30 = 3;
  lVar28 = 0;
  do {
    if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 <= lVar45) {
      if (this->o_rows == false) {
        return;
      }
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar38 = *(long *)&pMVar3->field_0x10;
      lVar27 = **(long **)&pMVar3->field_0x48;
      lVar43 = (long)(int)(uVar9 - 1);
      lVar30 = lVar38 + lVar27 * lVar43;
      lVar23 = lVar30 - lVar27;
      lVar18 = lVar23 - lVar27;
      lVar36 = *(long *)&pMVar5->field_0x10;
      lVar26 = **(long **)&pMVar5->field_0x48;
      lVar28 = lVar36 + lVar26 * lVar43;
      lVar10 = lVar28 + lVar26 * -2;
      lVar45 = lVar23 + 1;
      lVar33 = lVar18 + -1;
      lVar41 = (lVar43 + -1) * lVar27;
      lVar44 = lVar10 + 8;
      lVar11 = lVar26 * (lVar43 + -2) + lVar36 + 0x10;
      lVar36 = lVar36 + 8 + lVar26 * lVar43;
      lVar26 = lVar41 + 4 + lVar38;
      lVar1 = lVar38 + 3 + lVar27 * lVar43;
      lVar27 = (lVar43 + -2) * lVar27 + 3 + lVar38;
      uVar32 = 0xfffffffffffffffe;
LAB_00164985:
      lVar43 = (long)(int)uVar32;
      uVar32 = lVar43 + 2;
      if ((int)uVar32 < iVar35) {
        if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_001649da;
        if (*(char *)(lVar43 + 3 + lVar23) != '\0') goto LAB_00164b05;
        if (*(char *)(lVar30 + 3 + lVar43) != '\0') {
LAB_001649f5:
          uVar12 = (ulong)(int)uVar32;
          if (*(char *)(lVar23 + 2 + uVar12) == '\0') {
            if (*(char *)(lVar23 + uVar12) == '\0') goto LAB_00164cb0;
            goto LAB_00164a37;
          }
          if (*(char *)(lVar23 + uVar12) == '\0') goto LAB_00164ca5;
LAB_00164a0c:
          lVar43 = (long)(int)uVar32;
          if (*(char *)(lVar18 + 1 + lVar43) == '\0') {
            uVar9 = *(uint *)(lVar10 + lVar43 * 4);
            uVar25 = *(uint *)(lVar10 + 8 + lVar43 * 4);
            goto LAB_00164abe;
          }
          uVar9 = *(uint *)(lVar44 + lVar43 * 4);
LAB_00164ac8:
          *(uint *)(lVar28 + lVar43 * 4) = uVar9;
LAB_00164ccd:
          iVar40 = (int)uVar32;
          lVar22 = (long)iVar40;
          lVar14 = lVar22 << 0x20;
          lVar43 = lVar26 + lVar22;
          lVar13 = lVar11 + lVar22 * 4;
          lVar17 = lVar36 + lVar22 * 4;
          lVar16 = 0;
          do {
            uVar12 = lVar22 + lVar16 + 2;
            lVar21 = lVar14 >> 0x20;
            if (lVar4 <= (long)uVar12) {
              uVar32 = (ulong)(iVar40 + 2) + lVar16;
              if (iVar35 < (int)uVar32) {
LAB_001653ee:
                lVar45 = (long)(int)uVar32;
                if (*(char *)(lVar30 + lVar45) == '\0') {
LAB_0016557d:
                  *(undefined4 *)(lVar28 + lVar45 * 4) = 0;
                  return;
                }
                uVar15 = *(undefined4 *)(lVar28 + -8 + lVar45 * 4);
LAB_00165401:
                *(undefined4 *)(lVar28 + lVar45 * 4) = uVar15;
                return;
              }
              lVar45 = lVar14 + 0x200000000 >> 0x20;
              if (*(char *)(lVar30 + lVar45) == '\0') {
                if (*(char *)(lVar30 + 3 + lVar21) == '\0') {
                  *(undefined4 *)(lVar28 + lVar45 * 4) = 0;
                  return;
                }
              }
              else if (*(char *)(lVar23 + 3 + lVar21) == '\0') {
                uVar15 = *(undefined4 *)(lVar28 + lVar21 * 4);
                goto LAB_0016554a;
              }
              uVar15 = *(undefined4 *)(lVar10 + lVar45 * 4);
LAB_0016554a:
              *(undefined4 *)(lVar28 + lVar45 * 4) = uVar15;
              return;
            }
            if (*(char *)(lVar1 + lVar22 + -1 + lVar16) == '\0') {
              uVar32 = (ulong)(iVar40 + 2) + lVar16;
              iVar40 = (int)uVar32;
              lVar43 = lVar14 + 0x300000000 >> 0x20;
              if (*(char *)(lVar30 + lVar43) == '\0') goto LAB_00164ad5;
              if (*(char *)(lVar23 + lVar43) != '\0') goto LAB_00164c71;
              if (*(char *)(lVar23 + 4 + lVar21) == '\0') goto LAB_00164a37;
              goto LAB_00164a0c;
            }
            iVar42 = (int)lVar16;
            if (*(char *)(lVar43 + -1 + lVar16) != '\0') {
              uVar32 = (ulong)(iVar40 + iVar42 + 2);
              *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar13 + -8 + lVar16 * 4);
              goto LAB_001650d0;
            }
            if (*(char *)(lVar1 + lVar22 + lVar16) == '\0') {
              uVar32 = (ulong)(iVar40 + iVar42 + 2);
              *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar28 + (lVar14 >> 0x1e));
              goto LAB_00164985;
            }
            if (*(char *)(lVar43 + lVar16) == '\0') goto LAB_00164e57;
            uVar9 = *(uint *)(lVar13 + lVar16 * 4);
            if (*(char *)(lVar27 + lVar22 + lVar16) == '\0') {
              uVar9 = RemSP::Merge(uVar9,*(uint *)(lVar17 + -8 + lVar16 * 4));
            }
            *(uint *)(lVar17 + lVar16 * 4) = uVar9;
            lVar14 = lVar14 + 0x200000000;
            lVar16 = lVar16 + 2;
          } while( true );
        }
        uVar12 = uVar32;
        if (*(char *)(lVar23 + uVar32) == '\0') {
LAB_001649bb:
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar9 = RemSP::length_ + 1;
          *(uint *)(lVar28 + 8 + lVar43 * 4) = RemSP::length_;
          RemSP::length_ = uVar9;
          uVar32 = uVar12;
        }
        else {
LAB_00164b62:
          *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + 8 + lVar43 * 4);
          uVar32 = uVar12;
        }
        goto LAB_00164985;
      }
      if (iVar35 < (int)uVar32) {
        if (*(char *)(lVar30 + uVar32) == '\0') {
LAB_0016559a:
          *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = 0;
          return;
        }
      }
      else {
        if (*(char *)(lVar30 + uVar32) == '\0') {
LAB_001656c8:
          if (*(char *)(lVar30 + 1 + uVar32) == '\0') {
LAB_001656e9:
            *(undefined4 *)(lVar28 + uVar32 * 4) = 0;
            return;
          }
        }
        if (*(char *)(lVar23 + 1 + uVar32) != '\0') goto LAB_001656df;
      }
      if (*(char *)(lVar23 + uVar32) == '\0') {
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar9 = RemSP::length_ + 1;
        *(uint *)(lVar28 + uVar32 * 4) = RemSP::length_;
        RemSP::length_ = uVar9;
        return;
      }
LAB_001656df:
      uVar9 = *(uint *)(lVar10 + uVar32 * 4);
LAB_00165788:
      *(uint *)(lVar28 + uVar32 * 4) = uVar9;
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar1 = *(long *)&pMVar3->field_0x10;
    lVar27 = **(long **)&pMVar3->field_0x48;
    lVar41 = lVar27 * lVar45;
    lVar36 = lVar41 + lVar1;
    lVar33 = lVar36 - lVar27;
    lVar26 = lVar36 + lVar27;
    lVar38 = *(long *)&pMVar5->field_0x10;
    lVar43 = **(long **)&pMVar5->field_0x48;
    lVar10 = lVar43 * lVar45;
    lVar18 = lVar38 + lVar10;
    lVar11 = lVar18 + lVar43 * -2;
    cVar2 = *(char *)(lVar1 + lVar41);
    if (2 < (int)uVar25) {
      lVar23 = lVar33 - lVar27;
      uVar12 = 0;
      uVar32 = 0;
      if (cVar2 == '\0') goto LAB_00161d8d;
LAB_00161ce4:
      lVar13 = (long)(int)uVar12;
      if (*(char *)(lVar13 + 1 + lVar33) == '\0') {
        if (*(char *)(lVar36 + 1 + lVar13) != '\0') goto LAB_00161e18;
        if (*(char *)(lVar33 + lVar13) == '\0') {
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar8 = RemSP::length_ + 1;
          *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
          RemSP::length_ = uVar8;
          goto LAB_001621b2;
        }
        *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
        goto LAB_001628f7;
      }
      *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
LAB_00163ffd:
      iVar40 = (int)uVar12;
      lVar37 = (long)iVar40;
      lVar24 = lVar37 << 0x20;
      lVar13 = lVar1 + lVar41 + lVar37;
      lVar29 = lVar27 * lVar44 + lVar37;
      lVar21 = lVar27 * lVar30 + lVar37;
      lVar17 = lVar10 + lVar37 * 4;
      lVar16 = lVar38 + lVar17 + 8;
      lVar22 = lVar43 * lVar28 + lVar37 * 4;
      lVar39 = lVar38 + lVar22 + 8;
      lVar14 = 0;
LAB_00164078:
      uVar32 = lVar37 + lVar14 + 2;
      lVar20 = lVar24 >> 0x1e;
      lVar19 = lVar24 >> 0x20;
      iVar42 = (int)lVar14;
      if ((long)uVar32 < lVar4) {
        if (*(char *)(lVar13 + 2 + lVar14) == '\0') {
          uVar12 = (ulong)(iVar40 + 2) + lVar14;
          if (*(char *)(lVar14 + 2 + lVar21 + lVar1) == '\0') {
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_00161ddb;
          }
          lVar13 = lVar24 + 0x300000000 >> 0x20;
          lVar21 = lVar24 + 0x100000000 >> 0x20;
          if (*(char *)(lVar36 + lVar13) == '\0') {
            if (*(char *)(lVar26 + lVar21) != '\0') {
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar14 * 4) = *(undefined4 *)(lVar18 + lVar20);
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_00162463;
            }
            if (*(char *)(lVar36 + lVar21) == '\0') {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar8 = RemSP::length_ + 1;
              *(uint *)(lVar17 + lVar38 + 8 + lVar14 * 4) = RemSP::length_;
              RemSP::length_ = uVar8;
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_00162463;
            }
            *(undefined4 *)(lVar17 + lVar38 + 8 + lVar14 * 4) = *(undefined4 *)(lVar18 + lVar20);
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_00162463;
          }
          if (*(char *)(lVar36 + lVar21) != '\0') {
            uVar31 = lVar24 + 0x200000000 >> 0x20;
            goto LAB_00164203;
          }
          if (*(char *)(lVar26 + lVar21) == '\0') goto LAB_00161dec;
          if (*(char *)(lVar33 + lVar13) != '\0') goto LAB_00164217;
          if (*(char *)(lVar33 + 4 + lVar19) != '\0') {
            uVar31 = lVar24 + 0x200000000 >> 0x20;
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0016389a;
          }
          if (*(char *)(lVar14 + 2 + lVar29 + lVar1) == '\0') {
            *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar18 + lVar19 * 4);
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_00162a6a;
          }
LAB_00164464:
          *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar22 + lVar38 + 8 + lVar14 * 4);
          uVar32 = uVar12 & 0xffffffff;
LAB_00162fb2:
          lVar13 = (long)(int)uVar32;
          uVar12 = lVar13 + 2;
          if (iVar35 <= (int)uVar12) {
            if ((int)uVar12 <= iVar35) {
              uVar34 = uVar12 & 0xffffffff;
              if (*(char *)(lVar36 + uVar34) != '\0') {
LAB_00163009:
                if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
                  if (*(char *)(lVar23 + uVar34) == '\0') {
LAB_00163a28:
                    uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar34 * 4),
                                         *(uint *)(lVar18 + lVar13 * 4));
                    *(uint *)(lVar18 + uVar34 * 4) = uVar8;
                  }
                  else {
LAB_00163b7a:
                    lVar36 = (long)(int)uVar12;
                    uVar8 = *(uint *)(lVar11 + lVar36 * 4);
                    if (*(char *)(lVar23 + -1 + lVar36) == '\0') {
                      uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar36 * 4));
                      *(uint *)(lVar18 + lVar36 * 4) = uVar8;
                    }
                    else {
                      *(uint *)(lVar18 + lVar36 * 4) = uVar8;
                    }
                  }
                  goto LAB_001637d5;
                }
LAB_00163b96:
                *(undefined4 *)(lVar18 + uVar34 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
                goto LAB_001637d5;
              }
              if (*(char *)(lVar26 + uVar34) != '\0') {
                if (*(char *)(lVar36 + 3 + lVar13) != '\0') goto LAB_00163009;
                goto LAB_00163b96;
              }
LAB_00163761:
              uVar8 = (uint)uVar12;
              uVar12 = (ulong)(int)uVar8;
              if (*(char *)(uVar12 + 1 + lVar36) == '\0') goto LAB_00162023;
              cVar2 = *(char *)(lVar33 + 1 + uVar12);
              goto joined_r0x00163786;
            }
LAB_00162ff0:
            uVar8 = (uint)uVar12;
LAB_001637be:
            uVar12 = (ulong)(int)uVar8;
            if (*(char *)(lVar36 + uVar12) == '\0') {
LAB_001637c8:
              if (*(char *)(lVar26 + uVar12) != '\0') goto LAB_001637ce;
              goto LAB_001637ea;
            }
LAB_001637ce:
            uVar15 = *(undefined4 *)(lVar18 + -8 + uVar12 * 4);
            goto LAB_001637d2;
          }
          if (*(char *)(lVar36 + uVar12) == '\0') {
            if (*(char *)(lVar26 + uVar12) == '\0') goto LAB_00162bae;
            if (*(char *)(lVar13 + 3 + lVar36) == '\0') {
LAB_001630cd:
              *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_00162463;
            }
            if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
              uVar32 = uVar12;
              if (*(char *)(lVar23 + uVar12) == '\0') {
                uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),
                                     *(uint *)(lVar18 + lVar13 * 4));
                *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
                goto LAB_0016379b;
              }
LAB_0016353d:
              uVar8 = *(uint *)(lVar11 + uVar12 * 4);
              if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
                uVar12 = uVar32;
                goto LAB_0016379b;
              }
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              uVar12 = uVar32;
              goto LAB_0016379b;
            }
          }
          else {
            if (*(char *)(lVar13 + 3 + lVar33) != '\0') {
              uVar32 = uVar12;
              if (*(char *)(lVar23 + uVar12) == '\0') {
                uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),
                                     *(uint *)(lVar18 + lVar13 * 4));
                *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
              }
              else {
LAB_001633c3:
                uVar8 = *(uint *)(lVar11 + uVar12 * 4);
                if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                  uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                  *(uint *)(lVar18 + uVar12 * 4) = uVar8;
                  uVar12 = uVar32;
                }
                else {
                  *(uint *)(lVar18 + uVar12 * 4) = uVar8;
                  uVar12 = uVar32;
                }
              }
              goto LAB_00163ffd;
            }
            if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_001630e6;
          }
          if (*(char *)(lVar13 + 4 + lVar33) != '\0') {
            if (*(char *)(lVar23 + 3 + lVar13) == '\0') {
              uVar8 = RemSP::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),
                                   *(uint *)(lVar18 + lVar13 * 4));
              *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_00162c2b;
            }
            if (*(char *)(lVar23 + uVar12) == '\0') {
              uVar8 = RemSP::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),
                                   *(uint *)(lVar18 + lVar13 * 4));
              *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_00162c2b;
            }
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0016333d;
          }
LAB_001630f5:
          *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
          uVar32 = uVar12 & 0xffffffff;
LAB_001631ce:
          iVar40 = (int)uVar32;
LAB_001631d8:
          lVar14 = (long)iVar40;
          lVar16 = lVar14 << 0x20;
          lVar13 = lVar1 + lVar27 * lVar44 + lVar14;
          lVar22 = lVar1 + 3 + lVar41 + lVar14;
          lVar17 = lVar10 + lVar14 * 4;
          lVar21 = lVar38 + lVar17 + 8;
          lVar24 = 0;
LAB_00163232:
          uVar34 = lVar14 + lVar24 + 2;
          lVar29 = lVar16 >> 0x20;
          if (lVar4 <= (long)uVar34) {
            uVar12 = (ulong)(iVar40 + 2) + lVar24;
            uVar8 = (uint)uVar12;
            if (iVar35 < (int)uVar8) goto LAB_001637be;
            uVar34 = uVar34 & 0xffffffff;
            if (*(char *)(lVar36 + uVar34) != '\0') {
LAB_00163432:
              if (*(char *)(lVar33 + 3 + lVar29) == '\0') goto LAB_00163627;
              if (*(char *)(lVar23 + uVar34) == '\0') {
                uVar8 = *(uint *)(lVar11 + uVar34 * 4);
                uVar7 = *(uint *)(lVar18 + lVar29 * 4);
LAB_001626b3:
                uVar8 = RemSP::Merge(uVar8,uVar7);
                *(uint *)(lVar18 + uVar34 * 4) = uVar8;
                goto LAB_001637d5;
              }
              uVar12 = uVar12 & 0xffffffff;
LAB_00163b6c:
              lVar36 = (long)(int)uVar12;
              if (*(char *)(lVar36 + -2 + lVar33) == '\0') {
                uVar8 = RemSP::Merge(*(uint *)(lVar11 + lVar36 * 4),
                                     *(uint *)(lVar18 + -8 + lVar36 * 4));
                *(uint *)(lVar18 + lVar36 * 4) = uVar8;
                goto LAB_001637d5;
              }
              goto LAB_00163b7a;
            }
            if (*(char *)(lVar26 + uVar34) != '\0') {
              if (*(char *)(lVar36 + 3 + lVar29) != '\0') goto LAB_00163432;
LAB_00163627:
              uVar15 = *(undefined4 *)(lVar18 + lVar29 * 4);
LAB_0016362a:
              *(undefined4 *)(lVar18 + uVar34 * 4) = uVar15;
              goto LAB_001637d5;
            }
            uVar12 = uVar12 & 0xffffffff;
            goto LAB_00163761;
          }
          lVar37 = lVar16 >> 0x1e;
          iVar42 = (int)lVar24;
          if (*(char *)(lVar22 + -1 + lVar24) == '\0') {
            if (*(char *)(lVar27 * lVar30 + lVar14 + lVar1 + 2 + lVar24) == '\0') {
              uVar12 = (ulong)(iVar42 + iVar40 + 2);
              goto LAB_00162bae;
            }
            if (*(char *)(lVar22 + lVar24) == '\0') {
              uVar32 = (ulong)(iVar40 + iVar42 + 2);
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar24 * 4) = *(undefined4 *)(lVar18 + lVar37);
              goto LAB_00162463;
            }
            if (*(char *)(lVar13 + 3 + lVar24) != '\0') {
              uVar32 = (ulong)(iVar40 + 2) + lVar24;
              if (*(char *)(lVar24 + 2 + lVar27 * lVar28 + lVar14 + lVar1) == '\0') {
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar37);
              }
              else {
                if (*(char *)(lVar33 + lVar29) != '\0') {
                  uVar12 = lVar16 + 0x200000000 >> 0x20;
                  uVar32 = uVar32 & 0xffffffff;
                  goto LAB_0016353d;
                }
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar29 * 4);
              }
              uVar8 = RemSP::Merge(uVar8,uVar7);
              *(uint *)(lVar21 + lVar24 * 4) = uVar8;
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_0016379b;
            }
          }
          else {
            if (*(char *)(lVar13 + 3 + lVar24) != '\0') {
              uVar32 = (ulong)(iVar40 + 2) + lVar24;
              if (*(char *)(lVar24 + 2 + lVar27 * lVar28 + lVar14 + lVar1) == '\0') {
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar37);
              }
              else {
                if (*(char *)(lVar33 + lVar29) != '\0') {
                  uVar12 = lVar16 + 0x200000000 >> 0x20;
                  uVar32 = uVar32 & 0xffffffff;
                  goto LAB_001633c3;
                }
                uVar8 = *(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 8 + lVar24 * 4);
                uVar7 = *(uint *)(lVar18 + lVar29 * 4);
              }
              uVar8 = RemSP::Merge(uVar8,uVar7);
              *(uint *)(lVar21 + lVar24 * 4) = uVar8;
LAB_00163661:
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_00163ffd;
            }
            if (*(char *)(lVar22 + lVar24) == '\0') {
              iVar40 = iVar40 + iVar42 + 2;
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar24 * 4) = *(undefined4 *)(lVar18 + lVar37);
              goto LAB_001638ed;
            }
          }
          if (*(char *)(lVar13 + 4 + lVar24) == '\0') goto code_r0x00163288;
          uVar32 = (ulong)(iVar40 + 2) + lVar24;
          if (*(char *)(lVar23 + 3 + lVar29) == '\0') {
            uVar8 = RemSP::Merge(*(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 0x10 + lVar24 * 4
                                          ),*(uint *)(lVar18 + lVar29 * 4));
          }
          else {
            if ((*(char *)(lVar24 + 2 + lVar27 * lVar28 + lVar14 + lVar1) != '\0') &&
               (*(char *)(lVar33 + lVar29) != '\0')) {
              uVar12 = lVar16 + 0x200000000 >> 0x20;
LAB_0016333d:
              uVar8 = *(uint *)(lVar11 + 8 + uVar12 * 4);
              if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
              else {
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
              goto LAB_00162c2b;
            }
            uVar8 = RemSP::Merge(*(uint *)(lVar43 * lVar28 + lVar14 * 4 + lVar38 + 0x10 + lVar24 * 4
                                          ),*(uint *)(lVar18 + lVar29 * 4));
          }
          *(uint *)(lVar21 + lVar24 * 4) = uVar8;
LAB_00162c2b:
          iVar40 = (int)uVar32;
          lVar39 = (long)iVar40;
          lVar16 = lVar39 << 0x20;
          lVar13 = lVar10 + lVar39 * 4;
          lVar24 = lVar13 + lVar38 + 8;
          lVar14 = lVar27 * lVar44 + lVar39 + lVar1;
          lVar17 = lVar43 * lVar28 + lVar39 * 4 + lVar38;
          lVar29 = lVar17 + 8;
          lVar22 = lVar41 + lVar39 + lVar1;
          lVar21 = lVar22 + 3;
          lVar37 = 0;
          do {
            uVar12 = lVar39 + lVar37 + 2;
            lVar19 = lVar16 >> 0x20;
            iVar42 = (int)lVar37;
            if (lVar4 <= (long)uVar12) {
              uVar8 = iVar40 + 2 + iVar42;
              if (iVar35 < (int)uVar8) goto LAB_001637be;
              uVar12 = uVar12 & 0xffffffff;
              if (*(char *)(lVar36 + uVar12) == '\0') {
                cVar2 = *(char *)(lVar36 + 3 + lVar19);
                if (*(char *)(lVar26 + uVar12) == '\0') {
                  if (cVar2 == '\0') goto LAB_00162023;
                  goto LAB_00161d22;
                }
                if (cVar2 != '\0') goto LAB_00162e8b;
              }
              else {
LAB_00162e8b:
                if (*(char *)(lVar33 + 3 + lVar19) != '\0') goto LAB_00161d22;
              }
              uVar15 = *(undefined4 *)(lVar18 + lVar19 * 4);
              goto LAB_001637d2;
            }
            lVar20 = lVar16 >> 0x1e;
            if (*(char *)(lVar22 + 2 + lVar37) == '\0') {
              if (*(char *)(lVar27 * lVar30 + lVar39 + lVar1 + 2 + lVar37) == '\0') {
                uVar32 = (ulong)(iVar40 + 2) + lVar37;
                iVar40 = (int)uVar32;
                lVar13 = lVar16 + 0x300000000 >> 0x20;
                if (*(char *)(lVar36 + lVar13) == '\0') goto LAB_00161ed2;
                if (*(char *)(lVar33 + lVar13) != '\0') {
                  *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                  uVar12 = uVar32 & 0xffffffff;
                  goto LAB_0016379b;
                }
                if (*(char *)(lVar33 + 4 + lVar19) != '\0') goto LAB_00161e29;
                *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                goto LAB_00162fb2;
              }
              if (*(char *)(lVar21 + lVar37) == '\0') {
                uVar32 = (ulong)(iVar40 + iVar42 + 2);
                *(undefined4 *)(lVar13 + lVar38 + 8 + lVar37 * 4) = *(undefined4 *)(lVar18 + lVar20)
                ;
                goto LAB_00162463;
              }
              if (*(char *)(lVar14 + 3 + lVar37) != '\0') {
                uVar12 = (ulong)(iVar40 + iVar42 + 2);
                *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                goto LAB_0016379b;
              }
            }
            else {
              if (*(char *)(lVar14 + 3 + lVar37) != '\0') {
                *(undefined4 *)(lVar24 + lVar37 * 4) = *(undefined4 *)(lVar29 + lVar37 * 4);
                uVar12 = (ulong)(iVar40 + iVar42 + 2);
                goto LAB_00163ffd;
              }
              if (*(char *)(lVar21 + lVar37) == '\0') goto LAB_00162e39;
            }
            if (*(char *)(lVar14 + 4 + lVar37) == '\0') {
              iVar40 = iVar40 + iVar42 + 2;
              *(undefined4 *)(lVar13 + lVar38 + 8 + lVar37 * 4) = *(undefined4 *)(lVar18 + lVar20);
              goto LAB_001631d8;
            }
            uVar8 = *(uint *)(lVar17 + 0x10 + lVar37 * 4);
            if (*(char *)(lVar27 * lVar28 + lVar39 + lVar1 + 3 + lVar37) == '\0') {
              uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar13 + lVar38 + lVar37 * 4));
            }
            *(uint *)(lVar24 + lVar37 * 4) = uVar8;
            lVar16 = lVar16 + 0x200000000;
            lVar37 = lVar37 + 2;
          } while( true );
        }
        if ((*(char *)(lVar13 + 1 + lVar14) != '\0') ||
           (*(char *)(lVar1 + lVar21 + 1 + lVar14) != '\0')) {
          uVar32 = (ulong)(iVar40 + iVar42 + 2);
          goto LAB_0016384e;
        }
        if (*(char *)(lVar1 + lVar29 + 3 + lVar14) == '\0') {
          uVar12 = (ulong)(iVar40 + 2) + lVar14;
          if (*(char *)(lVar14 + 3 + lVar41 + lVar37 + lVar1) == '\0') {
            if (*(char *)(lVar14 + 2 + lVar29 + lVar1) == '\0') {
              *(undefined4 *)(lVar17 + lVar38 + 8 + lVar14 * 4) = *(undefined4 *)(lVar11 + lVar20);
              goto LAB_001621b2;
            }
            *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar39 + lVar14 * 4);
            goto LAB_001628f7;
          }
          cVar2 = *(char *)(lVar14 + 2 + lVar29 + lVar1);
          if (*(char *)(lVar33 + 4 + lVar19) != '\0') {
            if (cVar2 != '\0') {
              uVar32 = uVar12 & 0xffffffff;
              goto LAB_00161e29;
            }
            uVar31 = lVar24 + 0x200000000 >> 0x20;
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_0016459b;
          }
          if (cVar2 == '\0') {
            *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar11 + lVar19 * 4);
            uVar32 = uVar12 & 0xffffffff;
            goto LAB_00162a6a;
          }
          goto LAB_00164464;
        }
        if (*(char *)(lVar1 + lVar29 + 2 + lVar14) != '\0') goto code_r0x001640be;
        uVar12 = (ulong)(iVar40 + iVar42 + 2);
        lVar13 = lVar24 + 0x200000000 >> 0x20;
LAB_001642cd:
        if (*(char *)(lVar23 + lVar13) == '\0') {
          uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + lVar13 * 4),*(uint *)(lVar11 + lVar13 * 4));
          *(uint *)(lVar18 + lVar13 * 4) = uVar8;
        }
        else {
          *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
        }
        goto LAB_00163ffd;
      }
      uVar31 = (ulong)(iVar40 + 2) + lVar14;
      uVar12 = uVar32 & 0xffffffff;
      uVar8 = (uint)uVar31;
      if ((int)uVar8 <= iVar35) {
        if (*(char *)(lVar36 + uVar12) != '\0') {
          uVar32 = (ulong)(iVar42 + iVar40 + 1);
          if ((*(char *)(lVar36 + uVar32) == '\0') && (*(char *)(lVar26 + uVar32) == '\0')) {
            if (*(char *)(lVar33 + 3 + lVar19) == '\0') goto LAB_00164756;
            if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_00164761;
            lVar36 = lVar24 + 0x200000000 >> 0x20;
LAB_001625ee:
            if (*(char *)(lVar23 + lVar36) == '\0') {
              uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + lVar36 * 4),
                                   *(uint *)(lVar11 + lVar36 * 4));
              *(uint *)(lVar18 + lVar36 * 4) = uVar8;
              goto LAB_001637d5;
            }
            goto LAB_00164362;
          }
          goto LAB_00164350;
        }
        if (*(char *)(lVar26 + uVar12) == '\0') {
          uVar31 = uVar31 & 0xffffffff;
          goto LAB_0016200d;
        }
        uVar34 = (ulong)(iVar40 + iVar42 + 3);
        if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_00164532;
        uVar32 = (ulong)(iVar42 + iVar40 + 1);
        if (*(char *)(lVar36 + uVar32) != '\0') goto LAB_00164350;
        if (*(char *)(lVar26 + uVar32) == '\0') goto LAB_00161c88;
        if (*(char *)(lVar33 + uVar34) == '\0') {
          if (*(char *)(lVar33 + uVar12) == '\0') goto LAB_00164639;
          goto LAB_00164761;
        }
        lVar36 = lVar24 + 0x200000000 >> 0x20;
        goto LAB_0016435b;
      }
      if (*(char *)(lVar36 + uVar12) == '\0') {
        if (*(char *)(lVar26 + uVar12) == '\0') {
          *(undefined4 *)(lVar18 + uVar12 * 4) = 0;
          goto LAB_001637d5;
        }
LAB_00164532:
        uVar12 = (ulong)(iVar42 + iVar40 + 1);
        if ((*(char *)(lVar26 + uVar12) == '\0') && (*(char *)(lVar36 + uVar12) == '\0')) {
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar32 = uVar32 & 0xffffffff;
          uVar8 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
LAB_00164820:
          *(uint *)(lVar18 + uVar32 * 4) = uVar8;
          goto LAB_001637d5;
        }
        uVar15 = *(undefined4 *)(lVar18 + lVar20);
        uVar12 = uVar32 & 0xffffffff;
      }
      else {
        uVar32 = (ulong)(iVar42 + iVar40 + 1);
        if ((*(char *)(lVar36 + uVar32) == '\0') && (*(char *)(lVar26 + uVar32) == '\0')) {
LAB_00164756:
          if (*(char *)(lVar33 + uVar12) == '\0') {
            uVar15 = *(undefined4 *)(lVar11 + lVar20);
          }
          else {
LAB_00164761:
            uVar15 = *(undefined4 *)(lVar11 + uVar12 * 4);
          }
        }
        else {
LAB_00164639:
          uVar15 = *(undefined4 *)(lVar18 + lVar20);
        }
      }
LAB_00164834:
      *(undefined4 *)(lVar18 + uVar12 * 4) = uVar15;
      goto LAB_001637d5;
    }
    if (uVar25 == 2) {
      uVar32 = 0;
      uVar8 = 0;
      if (cVar2 == '\0') {
LAB_00161fee:
        uVar8 = (uint)uVar32;
        uVar12 = (ulong)(int)uVar8;
        if (*(char *)(lVar26 + uVar12) == '\0') {
LAB_0016200a:
          uVar31 = uVar32 & 0xffffffff;
LAB_0016200d:
          uVar8 = (uint)uVar31;
          if (*(char *)(lVar36 + 1 + (long)(int)uVar8) != '\0') goto LAB_00161c88;
LAB_00162023:
          uVar12 = (ulong)(int)uVar8;
          if (*(char *)(lVar26 + 1 + uVar12) == '\0') goto LAB_001637ea;
        }
        else if (*(char *)(lVar36 + 1 + uVar12) != '\0') goto LAB_00161c88;
LAB_00162031:
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar8 = RemSP::length_ + 1;
        *(uint *)(lVar18 + uVar12 * 4) = RemSP::length_;
        RemSP::length_ = uVar8;
      }
      else {
LAB_00161c88:
        uVar12 = (ulong)(int)uVar8;
        uVar31 = (ulong)uVar8;
        if (*(char *)(lVar33 + 1 + uVar12) == '\0') goto LAB_00161d14;
LAB_00161d22:
        uVar15 = *(undefined4 *)(lVar11 + uVar12 * 4);
LAB_001637d2:
        *(undefined4 *)(lVar18 + uVar12 * 4) = uVar15;
      }
    }
    else {
      uVar31 = 0;
      uVar32 = 0;
      if (cVar2 != '\0') {
LAB_00161d14:
        uVar12 = (ulong)(int)uVar31;
        cVar2 = *(char *)(lVar33 + uVar12);
joined_r0x00163786:
        if (cVar2 == '\0') goto LAB_00162031;
        goto LAB_00161d22;
      }
LAB_00161f97:
      uVar12 = (ulong)(int)uVar32;
      if (*(char *)(lVar26 + uVar12) != '\0') goto LAB_00162031;
LAB_001637ea:
      *(undefined4 *)(lVar18 + uVar12 * 4) = 0;
    }
LAB_001637d5:
    lVar45 = lVar45 + 2;
    lVar28 = lVar28 + 2;
    lVar44 = lVar44 + 2;
    lVar30 = lVar30 + 2;
  } while( true );
LAB_00161bda:
  *(undefined4 *)(lVar28 + uVar32 * 4) = *(undefined4 *)(lVar28 + -8 + uVar32 * 4);
  goto LAB_00161be3;
LAB_00164e57:
  uVar32 = (ulong)(iVar40 + iVar42 + 2);
  *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar28 + (lVar14 >> 0x1e));
LAB_00164ec6:
  iVar40 = (int)uVar32;
  lVar13 = (long)iVar40;
  lVar14 = lVar13 << 0x20;
  lVar17 = lVar26 + lVar13;
  lVar43 = lVar36 + lVar13 * 4;
  lVar22 = 0;
LAB_00164eef:
  lVar16 = lVar14 >> 0x20;
  if (lVar4 <= lVar13 + lVar22 + 2) {
    uVar12 = (ulong)(iVar40 + 2) + lVar22;
    if (iVar35 < (int)uVar12) {
      uVar32 = uVar12 & 0xffffffff;
      goto LAB_001653ee;
    }
    uVar32 = lVar14 + 0x200000000 >> 0x20;
    if (*(char *)(lVar30 + uVar32) == '\0') {
      uVar32 = uVar12 & 0xffffffff;
LAB_0016555d:
      lVar45 = (long)(int)uVar32;
      if (*(char *)(lVar45 + 1 + lVar30) == '\0') goto LAB_0016557d;
      if (*(char *)(lVar23 + 1 + lVar45) == '\0') {
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar9 = RemSP::length_ + 1;
        *(uint *)(lVar28 + lVar45 * 4) = RemSP::length_;
        RemSP::length_ = uVar9;
        return;
      }
      uVar15 = *(undefined4 *)(lVar10 + lVar45 * 4);
      goto LAB_00165401;
    }
    if (*(char *)(lVar23 + 3 + lVar16) == '\0') {
      uVar9 = *(uint *)(lVar28 + lVar16 * 4);
      goto LAB_00165788;
    }
    if ((*(char *)(lVar18 + uVar32) != '\0') && (*(char *)(lVar23 + lVar16) != '\0'))
    goto LAB_001654ff;
    uVar9 = *(uint *)(lVar10 + uVar32 * 4);
    uVar25 = *(uint *)(lVar28 + lVar16 * 4);
    goto LAB_00165783;
  }
  if (*(char *)(lVar1 + lVar13 + -1 + lVar22) == '\0') {
    uVar32 = (ulong)(iVar40 + (int)lVar22 + 2);
    goto LAB_00164c5a;
  }
  lVar21 = lVar14 >> 0x1e;
  if (*(char *)(lVar17 + -1 + lVar22) != '\0') goto LAB_00164f59;
  if (*(char *)(lVar1 + lVar13 + lVar22) == '\0') {
    uVar32 = (ulong)(iVar40 + (int)lVar22 + 2);
    *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar28 + lVar21);
    goto LAB_00164985;
  }
  if (*(char *)(lVar17 + lVar22) == '\0') {
    *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar43 + -8 + lVar22 * 4);
    lVar14 = lVar14 + 0x200000000;
    lVar22 = lVar22 + 2;
    goto LAB_00164eef;
  }
  uVar32 = (ulong)(iVar40 + 2) + lVar22;
  if ((*(char *)(lVar22 + lVar27 + lVar13) == '\0') ||
     (*(char *)(lVar22 + -1 + lVar27 + lVar13) == '\0')) {
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar21);
  }
  else {
    if (*(char *)(lVar23 + lVar16) != '\0') {
      uVar12 = lVar14 + 0x200000000 >> 0x20;
LAB_00165016:
      uVar9 = *(uint *)(lVar44 + uVar12 * 4);
      if (*(char *)(lVar33 + uVar12) == '\0') {
        uVar9 = RemSP::Merge(uVar9,*(uint *)(lVar28 + -8 + uVar12 * 4));
        *(uint *)(lVar28 + uVar12 * 4) = uVar9;
      }
      else {
        *(uint *)(lVar28 + uVar12 * 4) = uVar9;
      }
      goto LAB_00164ccd;
    }
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar16 * 4);
  }
  uVar9 = RemSP::Merge(uVar9,uVar25);
  *(uint *)(lVar43 + lVar22 * 4) = uVar9;
  goto LAB_00164ccd;
LAB_00164f59:
  uVar32 = (ulong)(iVar40 + 2) + lVar22;
  if (*(char *)(lVar22 + -1 + lVar27 + lVar13) == '\0') {
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + -8 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar21);
  }
  else {
    if (*(char *)(lVar23 + lVar16) != '\0') {
      lVar13 = lVar33;
      uVar12 = lVar14 + 0x200000000 >> 0x20;
      goto LAB_00165276;
    }
    uVar9 = *(uint *)(lVar11 + lVar13 * 4 + -8 + lVar22 * 4);
    uVar25 = *(uint *)(lVar28 + lVar16 * 4);
  }
  uVar9 = RemSP::Merge(uVar9,uVar25);
  *(uint *)(lVar43 + lVar22 * 4) = uVar9;
LAB_001650d0:
  iVar40 = (int)uVar32;
  lVar14 = (long)iVar40;
  lVar43 = lVar11 + lVar14 * 4;
  lVar13 = lVar41 + 2 + lVar38 + lVar14;
  lVar16 = lVar14 << 0x20;
  lVar17 = lVar36 + lVar14 * 4;
  lVar22 = 0;
LAB_00165104:
  uVar12 = lVar14 + lVar22 + 2;
  iVar42 = (int)lVar22;
  if (lVar4 <= (long)uVar12) {
    uVar32 = lVar16 + 0x200000000 >> 0x20;
    lVar45 = lVar16 >> 0x20;
    if (iVar35 < iVar42 + iVar40 + 2) {
      if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_001656e9;
      if (*(char *)(lVar30 + 1 + lVar45) != '\0') {
        uVar9 = *(uint *)(lVar28 + lVar45 * 4);
        goto LAB_00165788;
      }
    }
    else {
      if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_001656c8;
      if (*(char *)(lVar30 + 1 + lVar45) != '\0') goto LAB_0016542e;
      if (*(char *)(lVar23 + 3 + lVar45) != '\0') {
        if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_001656df;
LAB_0016564a:
        cVar2 = *(char *)(lVar18 + uVar32);
        goto joined_r0x00165654;
      }
    }
    if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_001656df;
    uVar9 = *(uint *)(lVar10 + (lVar16 >> 0x1e));
    goto LAB_00165788;
  }
  if (*(char *)(lVar1 + lVar14 + -1 + lVar22) == '\0') {
    uVar32 = (ulong)(iVar40 + iVar42 + 2);
    goto LAB_001649da;
  }
  if (*(char *)(lVar1 + lVar14 + -2 + lVar22) == '\0') {
    if (*(char *)(lVar13 + 1 + lVar22) != '\0') {
      if (*(char *)(lVar13 + lVar22) == '\0') goto LAB_00165259;
      *(undefined4 *)(lVar17 + lVar22 * 4) = *(undefined4 *)(lVar43 + -8 + lVar22 * 4);
      lVar22 = lVar22 + 2;
      lVar16 = lVar16 + 0x200000000;
      goto LAB_00165104;
    }
    uVar32 = (ulong)(iVar40 + 2) + lVar22;
    if (*(char *)(lVar1 + lVar14 + lVar22) == '\0') {
      if (*(char *)(lVar22 + lVar13) == '\0') {
        uVar15 = *(undefined4 *)(lVar43 + -0x10 + lVar22 * 4);
      }
      else {
        uVar15 = *(undefined4 *)(lVar43 + -8 + lVar22 * 4);
      }
      *(undefined4 *)(lVar17 + lVar22 * 4) = uVar15;
      goto LAB_00164985;
    }
    if (*(char *)(lVar22 + 2 + lVar13) == '\0') {
      if (*(char *)(lVar22 + lVar13) != '\0') goto LAB_00164a37;
      uVar31 = (ulong)*(uint *)(lVar43 + -0x10 + lVar22 * 4);
      goto LAB_00164bd3;
    }
    if (*(char *)(lVar22 + lVar13) != '\0') goto LAB_00164a0c;
    uVar12 = uVar32;
    uVar32 = lVar16 + 0x200000000 >> 0x20;
LAB_00165231:
    if ((*(char *)(lVar18 + 1 + uVar32) == '\0') || (*(char *)(lVar18 + uVar32) == '\0')) {
      uVar9 = RemSP::Merge(*(uint *)(lVar10 + -8 + uVar32 * 4),*(uint *)(lVar10 + 8 + uVar32 * 4));
    }
    else {
      uVar9 = *(uint *)(lVar44 + uVar32 * 4);
    }
    *(uint *)(lVar28 + uVar32 * 4) = uVar9;
    uVar32 = uVar12;
    goto LAB_00164ccd;
  }
  uVar32 = (ulong)(iVar40 + iVar42 + 2);
LAB_00165184:
  lVar43 = (long)(int)uVar32;
  if (*(char *)(lVar43 + 1 + lVar23) != '\0') {
    if (*(char *)(lVar23 + lVar43) == '\0') {
      uVar9 = *(uint *)(lVar10 + lVar43 * 4);
      if (*(char *)(lVar18 + lVar43) != '\0') {
        *(uint *)(lVar28 + lVar43 * 4) = uVar9;
        goto LAB_001650d0;
      }
      uVar9 = RemSP::Merge(uVar9,*(uint *)(lVar28 + -8 + lVar43 * 4));
    }
    else {
      uVar9 = *(uint *)(lVar10 + lVar43 * 4);
    }
    *(uint *)(lVar28 + lVar43 * 4) = uVar9;
    goto LAB_001650d0;
  }
  if (*(char *)(lVar30 + 1 + lVar43) == '\0') {
    *(undefined4 *)(lVar28 + lVar43 * 4) = *(undefined4 *)(lVar28 + -8 + lVar43 * 4);
    goto LAB_00164985;
  }
  if (*(char *)(lVar43 + 2 + lVar23) == '\0') {
    *(undefined4 *)(lVar28 + lVar43 * 4) = *(undefined4 *)(lVar28 + -8 + lVar43 * 4);
    goto LAB_00164ec6;
  }
  if (*(char *)(lVar18 + 1 + lVar43) == '\0') {
    uVar9 = *(uint *)(lVar10 + 8 + lVar43 * 4);
  }
  else {
    if (*(char *)(lVar23 + lVar43) != '\0') {
      uVar9 = *(uint *)(lVar10 + 8 + lVar43 * 4);
      goto LAB_00164ac8;
    }
    uVar9 = *(uint *)(lVar10 + 8 + lVar43 * 4);
    if (*(char *)(lVar18 + lVar43) != '\0') {
      *(uint *)(lVar28 + lVar43 * 4) = uVar9;
      goto LAB_00164ccd;
    }
  }
  uVar25 = *(uint *)(lVar28 + -8 + lVar43 * 4);
LAB_00164abe:
  uVar9 = RemSP::Merge(uVar9,uVar25);
  goto LAB_00164ac8;
LAB_00165259:
  uVar12 = lVar16 + 0x200000000 >> 0x20;
  lVar13 = lVar18;
  uVar32 = (ulong)(iVar40 + iVar42 + 2);
LAB_00165276:
  if (*(char *)(lVar13 + uVar12) == '\0') {
    uVar9 = RemSP::Merge(*(uint *)(lVar10 + -8 + uVar12 * 4),*(uint *)(lVar10 + uVar12 * 4));
  }
  else {
    uVar9 = *(uint *)(lVar10 + uVar12 * 4);
  }
  *(uint *)(lVar28 + uVar12 * 4) = uVar9;
  goto LAB_001650d0;
LAB_00164bd3:
  *(int *)(lVar28 + uVar12 * 4) = (int)uVar31;
  lVar43 = (long)(int)uVar32;
  uVar32 = lVar43 + 2;
  if (iVar35 <= (int)uVar32) {
    if (iVar35 < (int)uVar32) goto LAB_001653ee;
    if (*(char *)(lVar30 + uVar32) != '\0') {
      if (*(char *)(lVar23 + 3 + lVar43) == '\0') {
LAB_00165764:
        uVar9 = *(uint *)(lVar28 + lVar43 * 4);
      }
      else {
LAB_001655e9:
        uVar9 = RemSP::Merge(*(uint *)(lVar10 + 8 + lVar43 * 4),*(uint *)(lVar28 + lVar43 * 4));
      }
      *(uint *)(lVar28 + 8 + lVar43 * 4) = uVar9;
      return;
    }
    goto LAB_0016555d;
  }
  if (*(char *)(lVar30 + uVar32) == '\0') {
LAB_00164c5a:
    iVar40 = (int)uVar32;
    uVar12 = (ulong)iVar40;
    if (*(char *)(uVar12 + 1 + lVar30) == '\0') goto LAB_00164ad2;
    if (*(char *)(lVar23 + 1 + uVar12) != '\0') {
LAB_00164c71:
      do {
        *(undefined4 *)(lVar28 + uVar12 * 4) = *(undefined4 *)(lVar10 + uVar12 * 4);
        uVar32 = (long)(int)uVar32 + 2;
        if (iVar35 <= (int)uVar32) {
          if (iVar35 < (int)uVar32) goto LAB_001653ee;
          if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_001656c8;
          goto LAB_0016542e;
        }
        if (*(char *)(lVar30 + uVar32) != '\0') goto LAB_00165184;
LAB_001649da:
        while( true ) {
          iVar40 = (int)uVar32;
          uVar12 = (ulong)iVar40;
          if (*(char *)(uVar12 + 1 + lVar30) != '\0') break;
LAB_00164ad2:
          uVar12 = (ulong)iVar40;
LAB_00164ad5:
          *(undefined4 *)(lVar28 + uVar12 * 4) = 0;
          lVar43 = (long)iVar40;
          uVar12 = lVar43 + 2;
          uVar32 = uVar12;
          if (iVar35 <= (int)uVar12) {
            if (iVar35 < (int)uVar12) {
              if (*(char *)(lVar30 + uVar12) == '\0') goto LAB_0016559a;
LAB_00165733:
              if (*(char *)(lVar23 + uVar12) == '\0') {
                if (*(char *)(lVar23 + 1 + lVar43) == '\0') {
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar9 = RemSP::length_ + 1;
                  *(uint *)(lVar28 + 8 + lVar43 * 4) = RemSP::length_;
                  RemSP::length_ = uVar9;
                  return;
                }
                uVar15 = *(undefined4 *)(lVar10 + lVar43 * 4);
                goto LAB_0016573e;
              }
            }
            else {
              if (*(char *)(lVar30 + uVar12) == '\0') goto LAB_001656c8;
              if (*(char *)(lVar23 + 3 + lVar43) == '\0') goto LAB_00165733;
              if ((*(char *)(lVar23 + uVar12) == '\0') && (*(char *)(lVar23 + 1 + lVar43) != '\0'))
              goto LAB_0016564a;
            }
            uVar15 = *(undefined4 *)(lVar10 + 8 + lVar43 * 4);
LAB_0016573e:
            *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = uVar15;
            return;
          }
          if (*(char *)(lVar30 + uVar12) != '\0') {
            if (*(char *)(lVar43 + 3 + lVar23) != '\0') {
              if ((*(char *)(lVar23 + uVar12) != '\0') ||
                 (lVar13 = lVar18, *(char *)(lVar45 + lVar43) == '\0')) goto LAB_00164b05;
              goto LAB_00165276;
            }
            if (*(char *)(lVar30 + 3 + lVar43) == '\0') {
              if (*(char *)(lVar23 + uVar12) != '\0') goto LAB_00164b62;
              if (*(char *)(lVar45 + lVar43) == '\0') goto LAB_001649bb;
              *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + lVar43 * 4);
              goto LAB_00164985;
            }
            cVar2 = *(char *)(lVar43 + 2 + lVar23);
            if (*(char *)(lVar43 + 4 + lVar23) == '\0') {
              if (cVar2 != '\0') goto LAB_00164a37;
              if (*(char *)(lVar45 + lVar43) == '\0') {
                uVar31 = (ulong)RemSP::length_;
                RemSP::P_[uVar31] = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
              }
              else {
                uVar31 = (ulong)*(uint *)(lVar10 + lVar43 * 4);
              }
              goto LAB_00164bd3;
            }
            if (cVar2 != '\0') goto LAB_00164a0c;
            if (*(char *)(lVar45 + lVar43) != '\0') goto LAB_00165231;
            *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + 0x10 + lVar43 * 4);
            goto LAB_00164ccd;
          }
        }
      } while (*(char *)(lVar23 + 1 + uVar12) != '\0');
      goto LAB_001649f5;
    }
    uVar12 = (ulong)iVar40;
    if (*(char *)(uVar12 + 2 + lVar23) == '\0') goto LAB_00164cb0;
LAB_00164ca5:
    *(undefined4 *)(lVar28 + uVar12 * 4) = *(undefined4 *)(lVar10 + 8 + uVar12 * 4);
    goto LAB_00164ccd;
  }
  if (*(char *)(lVar43 + 3 + lVar23) != '\0') {
LAB_00164bf7:
    uVar9 = RemSP::Merge(*(uint *)(lVar10 + 8 + lVar43 * 4),*(uint *)(lVar28 + lVar43 * 4));
    *(uint *)(lVar28 + 8 + lVar43 * 4) = uVar9;
    goto LAB_001650d0;
  }
  if (*(char *)(lVar30 + 3 + lVar43) == '\0') {
LAB_00164c3c:
    *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar28 + lVar43 * 4);
    goto LAB_00164985;
  }
  if (*(char *)(lVar43 + 4 + lVar23) != '\0') goto LAB_00164c1f;
LAB_00164c4b:
  *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar28 + lVar43 * 4);
  goto LAB_00164ec6;
LAB_0016542e:
  if (*(char *)(lVar23 + 1 + uVar32) == '\0') {
    uVar9 = *(uint *)(lVar28 + -8 + uVar32 * 4);
    goto LAB_00165788;
  }
  if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_001656df;
  uVar9 = *(uint *)(lVar10 + uVar32 * 4);
  if (*(char *)(lVar18 + uVar32) != '\0') {
    *(uint *)(lVar28 + uVar32 * 4) = uVar9;
    return;
  }
  uVar25 = *(uint *)(lVar28 + -8 + uVar32 * 4);
  goto LAB_00165783;
LAB_00164b05:
  *(undefined4 *)(lVar28 + 8 + lVar43 * 4) = *(undefined4 *)(lVar10 + 8 + lVar43 * 4);
  goto LAB_001650d0;
LAB_00164a37:
  *(undefined4 *)(lVar28 + uVar12 * 4) = *(undefined4 *)(lVar10 + uVar12 * 4);
  lVar43 = (long)(int)uVar32;
  uVar32 = lVar43 + 2;
  if (iVar35 <= (int)uVar32) {
    if (iVar35 < (int)uVar32) goto LAB_001653ee;
    if (*(char *)(lVar30 + uVar32) == '\0') goto LAB_0016555d;
    if (*(char *)(lVar23 + 3 + lVar43) == '\0') goto LAB_00165764;
    if (*(char *)(lVar18 + uVar32) == '\0') goto LAB_001655e9;
    goto LAB_001654ff;
  }
  if (*(char *)(lVar30 + uVar32) != '\0') {
    if (*(char *)(lVar43 + 3 + lVar23) != '\0') {
      lVar13 = lVar33;
      uVar12 = uVar32;
      if (*(char *)(lVar18 + uVar32) != '\0') goto LAB_00165276;
      goto LAB_00164bf7;
    }
    if (*(char *)(lVar30 + 3 + lVar43) == '\0') goto LAB_00164c3c;
    if (*(char *)(lVar43 + 4 + lVar23) == '\0') goto LAB_00164c4b;
    if ((*(char *)(lVar18 + 3 + lVar43) == '\0') ||
       (uVar12 = uVar32, *(char *)(lVar18 + uVar32) == '\0')) goto LAB_00164c1f;
    goto LAB_00165016;
  }
  goto LAB_00164c5a;
LAB_001654ff:
  cVar2 = *(char *)(lVar18 + -1 + uVar32);
joined_r0x00165654:
  if (cVar2 != '\0') goto LAB_001656df;
  uVar9 = *(uint *)(lVar10 + -8 + uVar32 * 4);
  uVar25 = *(uint *)(lVar10 + uVar32 * 4);
LAB_00165783:
  uVar9 = RemSP::Merge(uVar9,uVar25);
  goto LAB_00165788;
LAB_00164cb0:
  uVar31 = (ulong)RemSP::length_;
  RemSP::P_[uVar31] = RemSP::length_;
  RemSP::length_ = RemSP::length_ + 1;
  goto LAB_00164bd3;
LAB_00164c1f:
  uVar9 = RemSP::Merge(*(uint *)(lVar10 + 0x10 + lVar43 * 4),*(uint *)(lVar28 + lVar43 * 4));
  *(uint *)(lVar28 + 8 + lVar43 * 4) = uVar9;
  goto LAB_00164ccd;
code_r0x00163288:
  *(undefined4 *)(lVar21 + lVar24 * 4) = *(undefined4 *)(lVar38 + lVar17 + lVar24 * 4);
  lVar16 = lVar16 + 0x200000000;
  lVar24 = lVar24 + 2;
  goto LAB_00163232;
LAB_00162e39:
  iVar40 = iVar40 + iVar42 + 2;
  *(undefined4 *)(lVar13 + lVar38 + 8 + lVar37 * 4) = *(undefined4 *)(lVar18 + lVar20);
LAB_001638ed:
  lVar13 = (long)iVar40;
  uVar12 = lVar13 + 2;
  if (iVar35 <= (int)uVar12) {
    uVar34 = uVar12 & 0xffffffff;
    if (iVar35 < (int)uVar12) {
      if (*(char *)(lVar36 + uVar34) == '\0') {
LAB_001639a2:
        iVar40 = (int)uVar12;
LAB_001639a7:
        if (*(char *)(lVar26 + uVar34) == '\0') {
          *(undefined4 *)(lVar18 + uVar34 * 4) = 0;
        }
        else {
LAB_001639b8:
          lVar36 = (long)iVar40;
          if (*(char *)(lVar26 + -1 + lVar36) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar8 = RemSP::length_ + 1;
            *(uint *)(lVar18 + lVar36 * 4) = RemSP::length_;
            RemSP::length_ = uVar8;
          }
          else {
            *(undefined4 *)(lVar18 + lVar36 * 4) = *(undefined4 *)(lVar18 + -8 + lVar36 * 4);
          }
        }
        goto LAB_001637d5;
      }
      if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_00163990:
        uVar31 = uVar12 & 0xffffffff;
        goto LAB_00161d14;
      }
    }
    else {
      if (*(char *)(lVar36 + uVar34) == '\0') {
        if (*(char *)(lVar26 + uVar34) == '\0') {
LAB_00163c23:
          uVar31 = uVar12 & 0xffffffff;
          goto LAB_0016200d;
        }
        if (*(char *)(lVar36 + 3 + lVar13) == '\0') {
LAB_00163c16:
          iVar40 = (int)uVar12;
          goto LAB_001639b8;
        }
      }
      if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_00163a67:
        uVar8 = (uint)uVar12;
        goto LAB_00161c88;
      }
      if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
        if (*(char *)(lVar33 + lVar13) == '\0') goto LAB_00163a28;
LAB_00163a06:
        lVar36 = (long)(int)uVar12;
        if (*(char *)(lVar23 + -1 + lVar36) != '\0') goto LAB_0016435b;
        uVar8 = RemSP::Merge(*(uint *)(lVar11 + lVar36 * 4),*(uint *)(lVar18 + -8 + lVar36 * 4));
        *(uint *)(lVar18 + lVar36 * 4) = uVar8;
        goto LAB_001637d5;
      }
    }
    if (*(char *)(lVar33 + uVar34) != '\0') goto LAB_00163b6c;
    goto LAB_00163b96;
  }
  if (*(char *)(lVar36 + uVar12) == '\0') {
    if (*(char *)(lVar26 + uVar12) == '\0') goto LAB_00163cea;
    if (*(char *)(lVar13 + 3 + lVar36) == '\0') goto LAB_00163bd9;
    if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00161dec;
    if (*(char *)(lVar33 + 3 + lVar13) != '\0') {
      if (*(char *)(lVar33 + lVar13) == '\0') goto LAB_00162b06;
      goto LAB_00163ac3;
    }
  }
  else {
    if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00161ce4;
    if (*(char *)(lVar13 + 3 + lVar33) != '\0') {
      if (*(char *)(lVar33 + lVar13) == '\0') {
LAB_00162a8e:
        uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
        *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
      }
      else {
LAB_00163934:
        if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
          uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
          *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        }
        else {
LAB_0016385b:
          lVar13 = (long)(int)uVar12;
          if (*(char *)(lVar33 + lVar13) == '\0') {
            uVar8 = *(uint *)(lVar11 + lVar13 * 4);
            if (*(char *)(lVar23 + lVar13) == '\0') {
              uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar13 * 4));
              *(uint *)(lVar18 + lVar13 * 4) = uVar8;
            }
            else {
              *(uint *)(lVar18 + lVar13 * 4) = uVar8;
            }
          }
          else {
            *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
          }
        }
      }
      goto LAB_00163ffd;
    }
    if (*(char *)(lVar36 + 3 + lVar13) == '\0') {
      if (*(char *)(lVar33 + uVar12) == '\0') goto LAB_00163dbf;
      if (*(char *)(lVar33 + lVar13) != '\0') goto LAB_00163d9c;
      uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
      *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
      goto LAB_001628f7;
    }
  }
  if (*(char *)(lVar13 + 4 + lVar33) == '\0') {
    if (*(char *)(lVar33 + 2 + lVar13) != '\0') {
      if (*(char *)(lVar33 + lVar13) == '\0') {
        uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
        *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
        uVar32 = uVar12 & 0xffffffff;
      }
      else {
LAB_00163ddc:
        uVar32 = uVar12 & 0xffffffff;
        uVar8 = *(uint *)(lVar11 + uVar12 * 4);
        if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
          uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
          *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        }
        else {
          *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        }
      }
      goto LAB_00162fb2;
    }
LAB_00163e02:
    *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
LAB_00162c19:
    uVar32 = uVar12 & 0xffffffff;
LAB_00162a6a:
    lVar13 = (long)(int)uVar32;
    uVar12 = lVar13 + 2;
    if (iVar35 <= (int)uVar12) {
      if (iVar35 < (int)uVar12) goto LAB_00162ff0;
      uVar34 = uVar12 & 0xffffffff;
      if (*(char *)(lVar36 + uVar34) == '\0') {
        if (*(char *)(lVar26 + uVar34) == '\0') goto LAB_00163761;
        if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_00163b96;
      }
      if (*(char *)(lVar33 + 3 + lVar13) == '\0') goto LAB_00163b96;
      goto LAB_00163a28;
    }
    if (*(char *)(lVar36 + uVar12) != '\0') {
      if (*(char *)(lVar13 + 3 + lVar33) != '\0') goto LAB_00162a8e;
      if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_001630e6;
LAB_00162b48:
      if (*(char *)(lVar13 + 4 + lVar33) == '\0') goto LAB_001630f5;
      uVar8 = RemSP::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
      *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
      uVar32 = uVar12 & 0xffffffff;
      goto LAB_00162c2b;
    }
    if (*(char *)(lVar26 + uVar12) == '\0') {
LAB_00162bae:
      iVar40 = (int)uVar12;
      lVar13 = (long)iVar40;
      if (*(char *)(lVar13 + 1 + lVar36) == '\0') goto LAB_00161ed2;
      if (*(char *)(lVar33 + 1 + lVar13) == '\0') goto LAB_00162bdc;
      *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    }
    else {
      if (*(char *)(lVar13 + 3 + lVar36) == '\0') goto LAB_001630cd;
      if (*(char *)(lVar33 + 3 + lVar13) == '\0') goto LAB_00162b48;
LAB_00162b06:
      uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
      *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
    }
LAB_0016379b:
    lVar13 = (long)(int)uVar12;
    uVar31 = lVar13 + 2;
    uVar8 = (uint)uVar31;
    uVar32 = uVar31;
    if (iVar35 <= (int)uVar8) {
      if (iVar35 < (int)uVar8) goto LAB_001637be;
      uVar12 = uVar31 & 0xffffffff;
      if (*(char *)(lVar36 + uVar12) != '\0') goto LAB_00164350;
      if (*(char *)(lVar26 + uVar12) == '\0') goto LAB_0016200a;
      if (*(char *)(lVar36 + 3 + lVar13) != '\0') goto LAB_00164350;
      uVar15 = *(undefined4 *)(lVar18 + lVar13 * 4);
      goto LAB_00164834;
    }
    if (*(char *)(lVar36 + uVar31) == '\0') {
      if (*(char *)(lVar26 + uVar31) == '\0') goto LAB_00161ddb;
      if (*(char *)(lVar36 + 3 + lVar13) == '\0') {
        *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
LAB_00162463:
        lVar13 = (long)(int)uVar32;
        uVar32 = lVar13 + 2;
        iVar40 = (int)uVar32;
        if (iVar40 < iVar35) {
          uVar31 = uVar32;
          if (*(char *)(lVar36 + uVar32) == '\0') goto LAB_0016228d;
          if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_0016209e;
LAB_00162490:
          iVar40 = (int)uVar32;
          uVar12 = (ulong)iVar40;
          if (*(char *)(uVar12 + 1 + lVar33) != '\0') {
            if ((*(char *)(lVar33 + uVar12) != '\0') || (*(char *)(lVar33 + -1 + uVar12) == '\0')) {
              uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar12 * 4),
                                   *(uint *)(lVar18 + -8 + uVar12 * 4));
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
LAB_001624d2:
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_00163ffd;
            }
            if (*(char *)(lVar23 + uVar12) == '\0') {
              uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + uVar12 * 4),
                                   *(uint *)(lVar11 + uVar12 * 4));
              uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
            }
            else {
              uVar8 = *(uint *)(lVar11 + uVar12 * 4);
              uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
            }
            uVar8 = RemSP::Merge(uVar8,uVar7);
            *(uint *)(lVar18 + uVar12 * 4) = uVar8;
            goto LAB_00163661;
          }
          if (*(char *)(lVar36 + 1 + uVar12) != '\0') {
            if (*(char *)(uVar12 + 2 + lVar33) != '\0') {
              if (*(char *)(lVar33 + uVar12) != '\0') {
                cVar2 = *(char *)(lVar23 + 1 + uVar12);
                goto joined_r0x001625c1;
              }
              if (*(char *)(lVar33 + -1 + uVar12) == '\0') {
                uVar8 = *(uint *)(lVar11 + 8 + uVar12 * 4);
                uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
              }
              else {
                if (*(char *)(lVar23 + 1 + uVar12) != '\0') {
                  if (*(char *)(lVar23 + uVar12) != '\0') goto LAB_00163ea9;
                  uVar8 = *(uint *)(lVar11 + -8 + uVar12 * 4);
                  goto LAB_00163ec3;
                }
                uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + uVar12 * 4),
                                     *(uint *)(lVar11 + 8 + uVar12 * 4));
                uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
              }
              uVar8 = RemSP::Merge(uVar8,uVar7);
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              goto LAB_00162c2b;
            }
            if (*(char *)(lVar33 + -1 + uVar12) != '\0') {
              uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + uVar12 * 4),
                                   *(uint *)(lVar18 + -8 + uVar12 * 4));
              *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              goto LAB_001631ce;
            }
LAB_00162377:
            if (*(char *)(lVar33 + uVar12) == '\0') {
              *(undefined4 *)(lVar18 + uVar12 * 4) = *(undefined4 *)(lVar18 + -8 + uVar12 * 4);
              goto LAB_00162a6a;
            }
            uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4))
            ;
            *(uint *)(lVar18 + uVar12 * 4) = uVar8;
            goto LAB_00162fb2;
          }
          uVar31 = (ulong)iVar40;
          if (*(char *)(lVar33 + -1 + uVar31) != '\0') {
            uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + uVar31 * 4),
                                 *(uint *)(lVar18 + -8 + uVar31 * 4));
            goto LAB_001638e5;
          }
LAB_0016280d:
          uVar12 = uVar32 & 0xffffffff;
          if (*(char *)(lVar33 + uVar31) != '\0') {
            uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar31 * 4),*(uint *)(lVar18 + -8 + uVar31 * 4))
            ;
            *(uint *)(lVar18 + uVar31 * 4) = uVar8;
            goto LAB_001628f7;
          }
          *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar18 + -8 + uVar31 * 4);
LAB_001621b2:
          lVar13 = (long)(int)uVar12;
          uVar31 = lVar13 + 2;
          iVar40 = (int)uVar31;
          if (iVar35 <= iVar40) {
            uVar34 = uVar31 & 0xffffffff;
            if (iVar40 <= iVar35) {
              if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_00162664;
              uVar34 = (ulong)iVar40;
              goto LAB_00162685;
            }
            if (*(char *)(lVar36 + uVar34) == '\0') {
              uVar12 = uVar31 & 0xffffffff;
              goto LAB_001639a2;
            }
            if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00161d14;
            uVar34 = (ulong)iVar40;
            goto LAB_001626a0;
          }
          if (*(char *)(lVar36 + uVar31) != '\0') goto code_r0x001621ce;
LAB_0016228d:
          uVar32 = uVar31 & 0xffffffff;
          uVar31 = (ulong)(int)uVar31;
          if (*(char *)(lVar26 + uVar31) != '\0') {
            if (*(char *)(lVar36 + 1 + uVar31) == '\0') goto LAB_0016242b;
            uVar12 = uVar32;
            if (*(char *)(lVar26 + -1 + uVar31) == '\0') goto LAB_00161dec;
LAB_001622ad:
            if (*(char *)(lVar33 + 1 + uVar31) == '\0') goto LAB_00162311;
            uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar31 * 4),*(uint *)(lVar18 + -8 + uVar31 * 4))
            ;
            *(uint *)(lVar18 + uVar31 * 4) = uVar8;
            uVar12 = uVar32;
            goto LAB_0016379b;
          }
LAB_00161ddb:
          while( true ) {
            while( true ) {
              while( true ) {
                iVar40 = (int)uVar32;
                uVar12 = uVar32 & 0xffffffff;
                if (*(char *)(lVar36 + 1 + (long)iVar40) != '\0') goto LAB_00161dec;
LAB_00161ed2:
                uVar8 = RemSP::length_;
                lVar13 = (long)iVar40;
                if (*(char *)(lVar26 + 1 + lVar13) == '\0') break;
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar7 = RemSP::length_ + 1;
                *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
                RemSP::length_ = uVar7;
                uVar31 = lVar13 + 2;
                iVar40 = (int)uVar31;
                if (iVar35 <= iVar40) {
                  uVar32 = uVar31 & 0xffffffff;
                  if (iVar35 < iVar40) {
                    if (*(char *)(lVar36 + uVar32) == '\0') {
                      uVar12 = (ulong)iVar40;
                      goto LAB_001637c8;
                    }
                    uVar32 = uVar31 & 0xffffffff;
                    goto LAB_0016255a;
                  }
                  if (*(char *)(lVar36 + uVar32) != '\0') {
                    uVar32 = uVar31 & 0xffffffff;
                    goto LAB_00162515;
                  }
                  if (*(char *)(lVar26 + uVar32) == '\0') goto LAB_0016200d;
                  if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_00164820;
                  uVar34 = (ulong)iVar40;
                  goto LAB_00162698;
                }
                if (*(char *)(lVar36 + uVar31) != '\0') {
                  uVar32 = uVar31 & 0xffffffff;
                  goto LAB_00162490;
                }
                if (*(char *)(lVar26 + uVar31) != '\0') {
                  if (*(char *)(lVar36 + 3 + lVar13) != '\0') {
                    uVar32 = uVar31 & 0xffffffff;
                    goto LAB_001622ad;
                  }
                  *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
                  uVar32 = uVar31 & 0xffffffff;
                  goto LAB_00162463;
                }
                uVar32 = uVar31 & 0xffffffff;
              }
              *(undefined4 *)(lVar18 + lVar13 * 4) = 0;
              uVar32 = lVar13 + 2;
              if (iVar35 <= (int)uVar32) {
                cVar2 = *(char *)(lVar36 + (uVar32 & 0xffffffff));
                if ((int)uVar32 <= iVar35) {
                  if (cVar2 != '\0') goto LAB_001625cc;
                  goto LAB_00161fee;
                }
                if (cVar2 != '\0') goto LAB_00162631;
                goto LAB_00161f97;
              }
              if (*(char *)(lVar36 + uVar32) != '\0') break;
LAB_00161d8d:
              lVar13 = (long)(int)uVar32;
              if (*(char *)(lVar26 + lVar13) != '\0') {
                if (*(char *)(lVar36 + 1 + lVar13) != '\0') {
                  uVar12 = uVar32 & 0xffffffff;
                  goto LAB_00161dec;
                }
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar8 = RemSP::length_ + 1;
                *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
                RemSP::length_ = uVar8;
                goto LAB_00162463;
              }
            }
LAB_0016209e:
            iVar40 = (int)uVar32;
            lVar13 = (long)iVar40;
            if (*(char *)(lVar13 + 1 + lVar33) != '\0') {
              if ((*(char *)(lVar33 + lVar13) != '\0') || (*(char *)(lVar33 + -1 + lVar13) == '\0'))
              {
                *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
                goto LAB_001624d2;
              }
              uVar12 = uVar32 & 0xffffffff;
              goto LAB_001642cd;
            }
            if (*(char *)(lVar36 + 1 + lVar13) != '\0') break;
            lVar13 = (long)iVar40;
            if (*(char *)(lVar33 + lVar13) == '\0') goto LAB_00162136;
            *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
            uVar12 = uVar32 & 0xffffffff;
LAB_001628f7:
            while( true ) {
              lVar13 = (long)(int)uVar12;
              uVar12 = lVar13 + 2;
              if (iVar35 <= (int)uVar12) {
                uVar34 = uVar12 & 0xffffffff;
                if (iVar35 < (int)uVar12) {
                  if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_001639a2;
                  if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00163990;
                }
                else {
                  if (*(char *)(lVar36 + uVar34) == '\0') {
                    if (*(char *)(lVar26 + uVar34) == '\0') goto LAB_00163c23;
                    if (*(char *)(lVar36 + 3 + lVar13) == '\0') goto LAB_00163c16;
                  }
                  if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00163a67;
                  if (*(char *)(lVar33 + 3 + lVar13) != '\0') goto LAB_00163a06;
                }
                if (*(char *)(lVar33 + uVar34) == '\0') goto LAB_00163b96;
                goto LAB_00163b7a;
              }
              if (*(char *)(lVar36 + uVar12) == '\0') break;
              if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00161ce4;
              if (*(char *)(lVar13 + 3 + lVar33) != '\0') goto LAB_00163934;
              if (*(char *)(lVar36 + 3 + lVar13) != '\0') goto LAB_001629ea;
              if (*(char *)(lVar33 + uVar12) == '\0') goto LAB_00163dbf;
LAB_00163d9c:
              uVar8 = *(uint *)(lVar11 + uVar12 * 4);
              if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
                uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar12 * 4));
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
              else {
                *(uint *)(lVar18 + uVar12 * 4) = uVar8;
              }
            }
            if (*(char *)(lVar26 + uVar12) != '\0') {
              if (*(char *)(lVar13 + 3 + lVar36) == '\0') goto LAB_00163bd9;
              if (*(char *)(lVar26 + 1 + lVar13) == '\0') goto LAB_00161dec;
              if (*(char *)(lVar33 + 3 + lVar13) != '\0') goto LAB_00163ac3;
LAB_001629ea:
              if (*(char *)(lVar13 + 4 + lVar33) == '\0') {
                if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_00163ddc;
                goto LAB_00163e02;
              }
              if (*(char *)(lVar23 + 3 + lVar13) != '\0') goto LAB_00163c8f;
              if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_00163e9c;
              goto LAB_00163e0e;
            }
LAB_00163cea:
            uVar32 = uVar12 & 0xffffffff;
          }
          uVar31 = (ulong)iVar40;
          if (*(char *)(lVar33 + 2 + uVar31) == '\0') {
            if (*(char *)(lVar33 + uVar31) != '\0') {
              *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar11 + uVar31 * 4);
              goto LAB_00162fb2;
            }
            if (*(char *)(lVar33 + -1 + uVar31) == '\0') {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar8 = RemSP::length_ + 1;
              *(uint *)(lVar18 + uVar31 * 4) = RemSP::length_;
              RemSP::length_ = uVar8;
            }
            else {
              *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar11 + -8 + uVar31 * 4);
            }
            goto LAB_00162a6a;
          }
          if (*(char *)(lVar33 + uVar31) != '\0') goto LAB_00161e29;
          if (*(char *)(lVar33 + -1 + uVar31) == '\0') goto LAB_001638b4;
LAB_0016459b:
          if ((*(char *)(lVar23 + 1 + uVar31) == '\0') || (*(char *)(lVar23 + uVar31) == '\0')) {
            uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + uVar31 * 4),
                                 *(uint *)(lVar11 + 8 + uVar31 * 4));
          }
          else {
            uVar8 = *(uint *)(lVar11 + 8 + uVar31 * 4);
          }
          *(uint *)(lVar18 + uVar31 * 4) = uVar8;
          goto LAB_00162c2b;
        }
        uVar34 = uVar32 & 0xffffffff;
        if (iVar35 < iVar40) {
          if (*(char *)(lVar36 + uVar34) == '\0') goto LAB_001639a7;
          if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_00162631:
            uVar12 = (ulong)(int)uVar32;
            if (*(char *)(lVar33 + uVar12) != '\0') goto LAB_00161d22;
            if (*(char *)(lVar33 + -1 + uVar12) == '\0') goto LAB_00162031;
            uVar15 = *(undefined4 *)(lVar11 + -8 + uVar12 * 4);
            goto LAB_001637d2;
          }
LAB_0016255a:
          uVar34 = (ulong)(int)uVar32;
          if (*(char *)(lVar33 + -1 + uVar34) == '\0') {
LAB_001626a0:
            if (*(char *)(lVar33 + uVar34) != '\0') goto LAB_001626a7;
            uVar15 = *(undefined4 *)(lVar18 + -8 + uVar34 * 4);
            goto LAB_0016362a;
          }
          uVar8 = *(uint *)(lVar11 + -8 + uVar34 * 4);
        }
        else {
          if (*(char *)(lVar36 + uVar34) == '\0') {
            uVar31 = uVar32 & 0xffffffff;
LAB_00162664:
            iVar40 = (int)uVar31;
            if (*(char *)(lVar26 + uVar34) == '\0') goto LAB_0016200d;
            uVar34 = (ulong)iVar40;
            if (*(char *)(lVar36 + 1 + uVar34) == '\0') goto LAB_001639b8;
LAB_00162685:
            uVar8 = (uint)uVar31;
            if (*(char *)(lVar26 + -1 + uVar34) == '\0') goto LAB_00161c88;
LAB_00162698:
            if (*(char *)(lVar33 + 1 + uVar34) == '\0') goto LAB_001626a0;
          }
          else {
            if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
LAB_001625cc:
              lVar36 = (long)(int)uVar32;
              if (*(char *)(lVar33 + 1 + lVar36) == '\0') goto LAB_00162631;
              if ((*(char *)(lVar33 + lVar36) != '\0') || (*(char *)(lVar33 + -1 + lVar36) == '\0'))
              goto LAB_00164362;
              goto LAB_001625ee;
            }
LAB_00162515:
            uVar34 = (ulong)(int)uVar32;
            if (*(char *)(lVar33 + 1 + uVar34) == '\0') goto LAB_0016255a;
            if ((*(char *)(lVar33 + uVar34) == '\0') && (*(char *)(lVar33 + -1 + uVar34) != '\0')) {
              if (*(char *)(lVar23 + uVar34) == '\0') {
                uVar8 = RemSP::Merge(*(uint *)(lVar11 + -8 + uVar34 * 4),
                                     *(uint *)(lVar11 + uVar34 * 4));
                uVar7 = *(uint *)(lVar18 + -8 + uVar34 * 4);
              }
              else {
                uVar8 = *(uint *)(lVar11 + uVar34 * 4);
                uVar7 = *(uint *)(lVar18 + -8 + uVar34 * 4);
              }
              uVar8 = RemSP::Merge(uVar8,uVar7);
              *(uint *)(lVar18 + uVar34 * 4) = uVar8;
              goto LAB_001637d5;
            }
          }
LAB_001626a7:
          uVar8 = *(uint *)(lVar11 + uVar34 * 4);
        }
        uVar7 = *(uint *)(lVar18 + -8 + uVar34 * 4);
        goto LAB_001626b3;
      }
      uVar12 = uVar31 & 0xffffffff;
LAB_00164203:
      uVar32 = uVar12 & 0xffffffff;
      if (*(char *)(lVar33 + 1 + uVar31) != '\0') goto LAB_00164217;
      goto LAB_0016388a;
    }
LAB_0016384e:
    iVar40 = (int)uVar32;
    uVar31 = (ulong)iVar40;
    if (*(char *)(uVar31 + 1 + lVar33) != '\0') {
      uVar12 = uVar32 & 0xffffffff;
      goto LAB_0016385b;
    }
    if (*(char *)(lVar36 + 1 + uVar31) != '\0') goto LAB_0016388a;
    uVar8 = *(uint *)(lVar18 + -8 + uVar31 * 4);
LAB_001638e5:
    *(uint *)(lVar18 + uVar31 * 4) = uVar8;
    goto LAB_001638ed;
  }
  if (*(char *)(lVar23 + 3 + lVar13) == '\0') {
    if (*(char *)(lVar33 + uVar12) == '\0') {
      uVar8 = *(uint *)(lVar11 + 0x10 + lVar13 * 4);
      uVar7 = *(uint *)(lVar18 + lVar13 * 4);
    }
    else {
      if (*(char *)(lVar33 + lVar13) != '\0') {
LAB_00163e9c:
        uVar32 = uVar12 & 0xffffffff;
        cVar2 = *(char *)(lVar23 + -1 + uVar12);
joined_r0x001625c1:
        if (cVar2 == '\0') {
          uVar8 = *(uint *)(lVar11 + uVar12 * 4);
LAB_00163ec3:
          uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar11 + 8 + uVar12 * 4));
          uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
        }
        else {
LAB_00163ea9:
          uVar8 = *(uint *)(lVar11 + 8 + uVar12 * 4);
          uVar7 = *(uint *)(lVar18 + -8 + uVar12 * 4);
        }
        uVar8 = RemSP::Merge(uVar8,uVar7);
        *(uint *)(lVar18 + uVar12 * 4) = uVar8;
        goto LAB_00162c2b;
      }
      uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar11 + 0x10 + lVar13 * 4))
      ;
      uVar7 = *(uint *)(lVar18 + lVar13 * 4);
    }
    uVar8 = RemSP::Merge(uVar8,uVar7);
    *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
    uVar32 = uVar12 & 0xffffffff;
    goto LAB_00162c2b;
  }
  if (*(char *)(lVar33 + lVar13) == '\0') {
LAB_00163e0e:
    uVar8 = RemSP::Merge(*(uint *)(lVar11 + 0x10 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
    *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
LAB_00162bef:
    uVar32 = uVar12 & 0xffffffff;
    goto LAB_00162c2b;
  }
LAB_00163c8f:
  uVar32 = uVar12 & 0xffffffff;
  cVar2 = *(char *)(lVar23 + -1 + uVar12);
  uVar31 = uVar12;
joined_r0x001638a4:
  if (cVar2 == '\0') {
    uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + uVar31 * 4),*(uint *)(lVar18 + -8 + uVar31 * 4));
  }
  else {
    if (*(char *)(lVar33 + uVar31) == '\0') {
      uVar8 = *(uint *)(lVar11 + 8 + uVar31 * 4);
      if (*(char *)(lVar23 + uVar31) == '\0') {
        uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + uVar31 * 4));
        *(uint *)(lVar18 + uVar31 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar18 + uVar31 * 4) = uVar8;
      }
      goto LAB_00162c2b;
    }
LAB_001638b4:
    uVar8 = *(uint *)(lVar11 + 8 + uVar31 * 4);
  }
  *(uint *)(lVar18 + uVar31 * 4) = uVar8;
  goto LAB_00162c2b;
LAB_001630e6:
  *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
  iVar40 = (int)uVar12;
  goto LAB_001638ed;
LAB_00162bdc:
  if (*(char *)(lVar13 + 2 + lVar33) != '\0') {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + 8 + lVar13 * 4);
    goto LAB_00162bef;
  }
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar8 = RemSP::length_ + 1;
  *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
  RemSP::length_ = uVar8;
  goto LAB_00162c19;
code_r0x001621ce:
  if (*(char *)(lVar26 + 1 + lVar13) == '\0') {
    uVar12 = uVar31 & 0xffffffff;
    goto LAB_00161ce4;
  }
  if (*(char *)(lVar13 + 3 + lVar33) != '\0') {
    uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + lVar13 * 4),*(uint *)(lVar18 + lVar13 * 4));
    *(uint *)(lVar18 + 8 + lVar13 * 4) = uVar8;
    uVar12 = uVar31 & 0xffffffff;
    goto LAB_00163ffd;
  }
  uVar32 = uVar31;
  if (*(char *)(lVar36 + 3 + lVar13) != '\0') {
LAB_00162311:
    uVar12 = (ulong)(int)uVar32;
    if (*(char *)(uVar12 + 2 + lVar33) == '\0') {
      uVar32 = uVar32 & 0xffffffff;
      goto LAB_00162377;
    }
    if (*(char *)(lVar23 + 1 + uVar12) == '\0') {
      if (*(char *)(lVar33 + uVar12) == '\0') {
        uVar7 = *(uint *)(lVar11 + 8 + uVar12 * 4);
        uVar8 = *(uint *)(lVar18 + -8 + uVar12 * 4);
      }
      else {
        uVar7 = RemSP::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar11 + 8 + uVar12 * 4));
        uVar8 = *(uint *)(lVar18 + -8 + uVar12 * 4);
      }
      uVar8 = RemSP::Merge(uVar7,uVar8);
      *(uint *)(lVar18 + uVar12 * 4) = uVar8;
      uVar32 = uVar32 & 0xffffffff;
    }
    else {
      uVar8 = RemSP::Merge(*(uint *)(lVar11 + 8 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
      *(uint *)(lVar18 + uVar12 * 4) = uVar8;
      uVar32 = uVar32 & 0xffffffff;
    }
    goto LAB_00162c2b;
  }
  goto LAB_0016280d;
LAB_00162136:
  if (*(char *)(lVar33 + -1 + lVar13) == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar8 = RemSP::length_ + 1;
    *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
    RemSP::length_ = uVar8;
  }
  else {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + -8 + lVar13 * 4);
  }
  uVar12 = uVar32 & 0xffffffff;
  goto LAB_001621b2;
LAB_00163bd9:
  uVar32 = uVar12 & 0xffffffff;
LAB_0016242b:
  lVar13 = (long)(int)uVar32;
  if (*(char *)(lVar26 + -1 + lVar13) == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar8 = RemSP::length_ + 1;
    *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
    RemSP::length_ = uVar8;
  }
  else {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar18 + -8 + lVar13 * 4);
  }
  goto LAB_00162463;
LAB_00163ac3:
  if (*(char *)(lVar23 + -1 + uVar12) == '\0') {
    uVar8 = RemSP::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar18 + -8 + uVar12 * 4));
    *(uint *)(lVar18 + uVar12 * 4) = uVar8;
  }
  else {
LAB_00164217:
    lVar13 = (long)(int)uVar12;
    if (*(char *)(lVar33 + lVar13) == '\0') {
      uVar8 = *(uint *)(lVar11 + lVar13 * 4);
      if (*(char *)(lVar23 + lVar13) == '\0') {
        uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar13 * 4));
        *(uint *)(lVar18 + lVar13 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar18 + lVar13 * 4) = uVar8;
      }
    }
    else {
      *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    }
  }
  goto LAB_0016379b;
LAB_00163dbf:
  *(undefined4 *)(lVar18 + 8 + lVar13 * 4) = *(undefined4 *)(lVar18 + lVar13 * 4);
  goto LAB_001621b2;
LAB_00161dec:
  lVar13 = (long)(int)uVar12;
  if (*(char *)(lVar33 + 1 + lVar13) != '\0') {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    goto LAB_0016379b;
  }
LAB_00161e18:
  uVar32 = uVar12 & 0xffffffff;
  lVar13 = (long)(int)uVar12;
  if (*(char *)(lVar33 + 2 + lVar13) != '\0') {
    if (*(char *)(lVar33 + lVar13) != '\0') goto LAB_00161e29;
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + 8 + lVar13 * 4);
    goto LAB_00162c2b;
  }
  if (*(char *)(lVar33 + lVar13) != '\0') {
    *(undefined4 *)(lVar18 + lVar13 * 4) = *(undefined4 *)(lVar11 + lVar13 * 4);
    goto LAB_00162fb2;
  }
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar8 = RemSP::length_ + 1;
  *(uint *)(lVar18 + lVar13 * 4) = RemSP::length_;
  RemSP::length_ = uVar8;
  goto LAB_00162a6a;
LAB_00161e29:
  lVar13 = (long)(int)uVar32;
  if (*(char *)(lVar23 + 1 + lVar13) == '\0') {
    uVar8 = RemSP::Merge(*(uint *)(lVar11 + lVar13 * 4),*(uint *)(lVar11 + 8 + lVar13 * 4));
  }
  else {
    uVar8 = *(uint *)(lVar11 + 8 + lVar13 * 4);
  }
  *(uint *)(lVar18 + lVar13 * 4) = uVar8;
  goto LAB_00162c2b;
LAB_0016388a:
  if (*(char *)(lVar33 + 2 + uVar31) != '\0') {
LAB_0016389a:
    cVar2 = *(char *)(lVar23 + 1 + uVar31);
    goto joined_r0x001638a4;
  }
  *(undefined4 *)(lVar18 + uVar31 * 4) = *(undefined4 *)(lVar18 + -8 + uVar31 * 4);
  goto LAB_001631ce;
code_r0x001640be:
  *(undefined4 *)(lVar16 + lVar14 * 4) = *(undefined4 *)(lVar39 + lVar14 * 4);
  lVar24 = lVar24 + 0x200000000;
  lVar14 = lVar14 + 2;
  goto LAB_00164078;
LAB_00164350:
  lVar36 = (long)(int)uVar31;
  if (*(char *)(lVar33 + 1 + lVar36) == '\0') {
    uVar15 = *(undefined4 *)(lVar18 + -8 + lVar36 * 4);
  }
  else {
LAB_0016435b:
    if (*(char *)(lVar33 + lVar36) == '\0') {
      uVar8 = *(uint *)(lVar11 + lVar36 * 4);
      if (*(char *)(lVar23 + lVar36) == '\0') {
        uVar8 = RemSP::Merge(uVar8,*(uint *)(lVar18 + -8 + lVar36 * 4));
        *(uint *)(lVar18 + lVar36 * 4) = uVar8;
      }
      else {
        *(uint *)(lVar18 + lVar36 * 4) = uVar8;
      }
      goto LAB_001637d5;
    }
LAB_00164362:
    uVar15 = *(undefined4 *)(lVar11 + lVar36 * 4);
  }
  *(undefined4 *)(lVar18 + lVar36 * 4) = uVar15;
  goto LAB_001637d5;
LAB_00161781:
  uVar15 = *(undefined4 *)(lVar4 + uVar12 * 4);
  uVar32 = uVar31 & 0xffffffff;
LAB_00161787:
  *(undefined4 *)(lVar4 + uVar31 * 4) = uVar15;
  goto LAB_00161704;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}